

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

int __thiscall smf::MidiMessage::getControllerNumber(MidiMessage *this)

{
  pointer puVar1;
  bool bVar2;
  uint uVar3;
  
  bVar2 = isController(this);
  uVar3 = 0xffffffff;
  if ((bVar2) &&
     (puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
     1 < (ulong)((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1))) {
    uVar3 = puVar1[1] & 0x7f;
  }
  return uVar3;
}

Assistant:

int MidiMessage::getControllerNumber(void) const {
  if (isController()) {
		int output = getP1();
		if (output < 0) {
			// -1 means no P1, although isController() is false in such a case.
			return output;
		} else {
			return 0x7f & output;
		}
	} else {
		return -1;
	}
}